

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Fun_Caller<std::__cxx11::string,chaiscript::Boxed_Value_const&>,std::__cxx11::string,chaiscript::Boxed_Value_const&,0ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1,
          undefined8 param_2,undefined8 param_3,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_4)

{
  Type_Conversions_State *in_stack_00000090;
  Boxed_Value *in_stack_00000098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_4,0);
  boxed_cast<chaiscript::Boxed_Value_const&>(in_stack_00000098,in_stack_00000090);
  Fun_Caller<std::__cxx11::string,chaiscript::Boxed_Value_const&>::operator()
            ((Fun_Caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_chaiscript::Boxed_Value_&>
              *)this,(Boxed_Value *)param_1);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x43fca9);
  return param_1;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }